

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

slReturn ubxSetNMEAData(int fdPort,int verbosity,_Bool nmeaOn)

{
  ubxMsg pollMsg;
  ubxMsg msg;
  _Bool _Var1;
  uint16_t uVar2;
  char *msg_00;
  void *pvVar3;
  slBuffer *body;
  uint64_t uVar4;
  char *pcVar5;
  errorInfo_slReturn local_b8;
  ubxMsg local_98;
  slReturn local_80;
  slReturn ackResp;
  slBuffer *bdy;
  slReturn resp;
  ubxMsg current;
  ubxMsg poll;
  _Bool currentState;
  slReturn cn;
  char *onoff;
  _Bool nmeaOn_local;
  int verbosity_local;
  int fdPort_local;
  
  msg_00 = "off";
  if (nmeaOn) {
    msg_00 = "on";
  }
  if (2 < verbosity) {
    printf("Querying to see if GPS UART already has NMEA data turned %s...\n",msg_00);
  }
  _verbosity_local = (slBuffer *)isNmeaOn(fdPort);
  _Var1 = isErrorReturn(_verbosity_local);
  if (!_Var1) {
    pvVar3 = getReturnInfo(_verbosity_local);
    if ((pvVar3 != (void *)0x0) == nmeaOn) {
      if (2 < verbosity) {
        printf("GPS UART already has NMEA data turned %s...\n",msg_00);
      }
      _verbosity_local = (slBuffer *)makeOkReturn();
    }
    else {
      if (2 < verbosity) {
        printf("Polling GPS UART configuration...\n");
      }
      body = init_slBuffer_int(1,LittleEndian);
      createUbxMsg((ubxMsg *)&current.checksum,ut_CFG_PRT,body);
      pollMsg.body = (slBuffer *)poll._0_8_;
      pollMsg.type.class = current.checksum.ck_a;
      pollMsg.type.id = current.checksum.ck_b;
      pollMsg._2_6_ = current._18_6_;
      pollMsg._16_8_ = poll.body;
      bdy = (slBuffer *)pollUbx(fdPort,pollMsg,1000,(ubxMsg *)&resp);
      _Var1 = isErrorReturn(bdy);
      if (_Var1) {
        _verbosity_local = bdy;
      }
      else {
        ackResp = (slReturn)current._0_8_;
        uVar2 = get_uint16_slBuffer((slBuffer *)current._0_8_,0xe);
        uVar4 = setBit_slBits((ulong)uVar2,1,nmeaOn);
        put_uint16_slBuffer((slBuffer *)current._0_8_,0xe,(uint16_t)uVar4);
        if (2 < verbosity) {
          printf("Sending new configuration to GPS with NMEA data turned %s for the UART...\n",
                 msg_00);
        }
        createUbxMsg(&local_98,ut_CFG_PRT,(slBuffer *)ackResp);
        msg.body = local_98.body;
        msg.type = local_98.type;
        msg._2_6_ = local_98._2_6_;
        msg.checksum = local_98.checksum;
        msg._18_6_ = local_98._18_6_;
        local_80 = sendUbxAckedMsg(fdPort,msg);
        _Var1 = isOkReturn(local_80);
        if (_Var1) {
          if (0 < verbosity) {
            printf("Successfully set new configuration to turn NMEA data %s for GPS UART...\n",
                   msg_00);
          }
          _verbosity_local = (slBuffer *)makeOkReturn();
        }
        else {
          if (0 < verbosity) {
            printf("Failed to change GPS UART configuration to turn NMEA data %s...\n",msg_00);
          }
          createErrorInfo(&local_b8,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                          ,"ubxSetNMEAData",0x4de,local_80);
          pcVar5 = getReturnMsg(local_80);
          _verbosity_local = (slBuffer *)makeErrorFmtMsgReturn(0x11e250,msg_00,pcVar5);
        }
      }
    }
  }
  return _verbosity_local;
}

Assistant:

extern slReturn ubxSetNMEAData(int fdPort, int verbosity, bool nmeaOn) {

    char* onoff = nmeaOn ? "on" : "off";

    // first we poll for the current configuration...
    if (verbosity >= 3) printf("Querying to see if GPS UART already has NMEA data turned %s...\n", onoff);
    slReturn cn = isNmeaOn(fdPort);
    if (isErrorReturn(cn)) return cn;

    // extract our state information...
    bool currentState = getReturnInfoBool(cn);

    // if we're already in the state we want, just leave...
    if (currentState == nmeaOn) {
        if (verbosity >= 3) printf("GPS UART already has NMEA data turned %s...\n", onoff);
        return makeOkReturn();
    }

    // change the configuration to the way we want it, starting with polling it again...
    if (verbosity >= 3) printf("Polling GPS UART configuration...\n");
    ubxMsg poll = createUbxMsg(ut_CFG_PRT, init_slBuffer(LittleEndian, 1));  // UART is index 1; defines won't work here...
    ubxMsg current;
    slReturn resp = pollUbx(fdPort, poll, CFG_PRT_MAX_MS, &current);
    if (isErrorReturn(resp)) return resp;

    // now change the bit we need to diddle...
    slBuffer *bdy = current.body;
    put_uint16_slBuffer(bdy, 14, (uint16_t) setBit_slBits(get_uint16_slBuffer(bdy, 14), 1, nmeaOn));

    // send out the message to actually make the change...
    if (verbosity >= 3) printf("Sending new configuration to GPS with NMEA data turned %s for the UART...\n", onoff);
    slReturn ackResp = sendUbxAckedMsg(fdPort, createUbxMsg(ut_CFG_PRT, bdy));
    if (isOkReturn(ackResp)) {
        if (verbosity >= 1) printf("Successfully set new configuration to turn NMEA data %s for GPS UART...\n", onoff);
        return makeOkReturn();
    }
    else {
        if (verbosity >= 1) printf("Failed to change GPS UART configuration to turn NMEA data %s...\n", onoff);
        return makeErrorFmtMsgReturn(ERR_CAUSE(ackResp), "failed to change GPS UART configuration to turn NMEA data %s: %s", onoff, getReturnMsg(ackResp));
    }
}